

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O3

int nghttp2_submit_goaway
              (nghttp2_session *session,uint8_t flags,int32_t last_stream_id,uint32_t error_code,
              uint8_t *opaque_data,size_t opaque_data_len)

{
  int iVar1;
  
  if ((session->goaway_flags & 1) == 0) {
    iVar1 = nghttp2_session_add_goaway
                      (session,last_stream_id,error_code,opaque_data,opaque_data_len,'\0');
    return iVar1;
  }
  return 0;
}

Assistant:

int nghttp2_submit_goaway(nghttp2_session *session, uint8_t flags,
                          int32_t last_stream_id, uint32_t error_code,
                          const uint8_t *opaque_data, size_t opaque_data_len) {
  (void)flags;

  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_ON_SEND) {
    return 0;
  }
  return nghttp2_session_add_goaway(session, last_stream_id, error_code,
                                    opaque_data, opaque_data_len,
                                    NGHTTP2_GOAWAY_AUX_NONE);
}